

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::moveCursorPosition(Private *this,usize from,ssize x)

{
  usize *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte *data;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *__format;
  String add;
  String moveCmd;
  String local_70;
  String local_48;
  
  uVar5 = this->stdoutScreenWidth;
  if (uVar5 == 0) {
    __assert_fail("stdoutScreenWidth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                  ,0x166,"void Console::Prompt::Private::moveCursorPosition(usize, ssize)");
  }
  uVar2 = from / uVar5;
  uVar4 = from % uVar5;
  uVar3 = (x + from) / uVar5;
  uVar5 = (x + from) % uVar5;
  local_48.data = &String::emptyData.super_Data;
  lVar6 = uVar3 - uVar2;
  if (uVar2 <= uVar3) {
    if (uVar2 <= uVar3 && lVar6 != 0) {
      __format = "\x1b[%dB";
      goto LAB_00105169;
    }
  }
  else {
    lVar6 = uVar2 - uVar3;
    __format = "\x1b[%dA";
LAB_00105169:
    String::printf(&local_48,__format,lVar6);
  }
  if (uVar5 < uVar4) {
    local_70.data = &String::emptyData.super_Data;
    String::printf(&local_70,"\x1b[%dD",(ulong)(uint)((int)uVar4 - (int)uVar5));
    String::append(&local_48,&local_70);
  }
  else {
    if (uVar5 <= uVar4) goto LAB_001051f6;
    local_70.data = &String::emptyData.super_Data;
    String::printf(&local_70,"\x1b[%dC",(ulong)(uint)((int)uVar5 - (int)uVar4));
    String::append(&local_48,&local_70);
  }
  if ((local_70.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_70.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_70.data != (Data *)0x0)) {
      operator_delete__(local_70.data);
    }
  }
LAB_001051f6:
  if ((local_48.data)->len != 0) {
    data = (byte *)String::operator_cast_to_char_(&local_48);
    Buffer::append(&this->bufferedOutput,data,(local_48.data)->len);
  }
  if ((local_48.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_48.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_48.data != (Data *)0x0)) {
      operator_delete__(local_48.data);
    }
  }
  return;
}

Assistant:

void moveCursorPosition(usize from, ssize x)
  {
#ifdef _MSC_VER
    usize to = from + x;
    usize oldY = from / stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    usize cursorX, cursorY;
    getCursorPosition(cursorX, cursorY);
    COORD pos = {(SHORT)newX, (SHORT)(cursorY + ((ssize)newY - (ssize)oldY))};
    VERIFY(SetConsoleCursorPosition(hOriginalStdOut, pos)); // this resets the caret blink timer
#else
    usize to = from + x;
    assert(stdoutScreenWidth != 0);
    usize oldY = from / stdoutScreenWidth;
    usize oldX = from % stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    String moveCmd;
    if(newY < oldY)
      moveCmd.printf("\x1b[%dA", (int)(oldY - newY));
    else if(newY > oldY)
      moveCmd.printf("\x1b[%dB", (int)(newY - oldY));
    if(newX < oldX)
    {
      String add;
      add.printf("\x1b[%dD", (int)(oldX - newX));
      moveCmd += add;
    }
    else if(newX > oldX)
    {
      String add;
      add.printf("\x1b[%dC", (int)(newX - oldX));
      moveCmd += add;
    }
    if(!moveCmd.isEmpty())
      writeConsole(moveCmd, moveCmd.length());
#endif
  }